

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_cmd_ln.c
# Opt level: O2

int validate_agc(char *switch_name,void *arg)

{
  int iVar1;
  int iVar2;
  
  iVar1 = strcmp((char *)arg,"max");
  iVar2 = 1;
  if (iVar1 != 0) {
    iVar1 = strcmp((char *)arg,"emax");
    if (iVar1 != 0) {
      iVar1 = strcmp((char *)arg,"none");
      if (iVar1 != 0) {
        iVar2 = 0;
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/train_cmd_ln.c"
                ,0xc6,"Unknown agc type %s %s\n",switch_name,arg);
      }
    }
  }
  return iVar2;
}

Assistant:

int
validate_agc(char *switch_name, void *arg)
{
    if ((strcmp(arg, "max") == 0) || (strcmp(arg, "emax") == 0) || (strcmp(arg, "none") == 0)) {
	return TRUE;
    }
    else {
	E_ERROR("Unknown agc type %s %s\n", switch_name, arg);

	return FALSE;
    }

    assert(FALSE);
}